

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O2

void SpawnShootDecal(AActor *t1,FTraceResults *trace)

{
  AWeapon *this;
  int iVar1;
  undefined4 extraout_var;
  
  if ((t1->player != (player_t *)0x0) && (this = t1->player->ReadyWeapon, this != (AWeapon *)0x0)) {
    t1 = AActor::GetDefault((AActor *)this);
  }
  if (t1->DecalGenerator != (FDecalBase *)0x0) {
    iVar1 = (**t1->DecalGenerator->_vptr_FDecalBase)();
    DImpactDecal::StaticCreate
              ((FDecalTemplate *)CONCAT44(extraout_var,iVar1),&trace->HitPos,
               trace->Line->sidedef[trace->Side],trace->ffloor,(PalEntry)0x0);
    return;
  }
  return;
}

Assistant:

void SpawnShootDecal(AActor *t1, const FTraceResults &trace)
{
	FDecalBase *decalbase = NULL;

	if (t1->player != NULL && t1->player->ReadyWeapon != NULL)
	{
		decalbase = t1->player->ReadyWeapon->GetDefault()->DecalGenerator;
	}
	else
	{
		decalbase = t1->DecalGenerator;
	}
	if (decalbase != NULL)
	{
		DImpactDecal::StaticCreate(decalbase->GetDecal(),
			trace.HitPos, trace.Line->sidedef[trace.Side], trace.ffloor);
	}
}